

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Buffers::ErrorsTest::TestErrorsOfNamedBufferStorage(ErrorsTest *this)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  int iVar8;
  undefined4 extraout_var_00;
  undefined7 extraout_var;
  _Elt_pointer puVar10;
  GLuint not_a_buffer_name;
  GLuint GVar11;
  GLuint i;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  GLuint buffer;
  undefined4 local_220;
  GLubyte dummy_data [4];
  stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> too_much_buffers;
  Enum<int,_2UL> local_1c0;
  GLuint tmp_buffer;
  undefined4 uStack_1ac;
  ostringstream local_1a8 [376];
  long lVar9;
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var_00,iVar6);
  buffer = 0;
  dummy_data[0] = '\0';
  dummy_data[1] = '\0';
  dummy_data[2] = '\0';
  dummy_data[3] = '\0';
  std::stack<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>>::
  stack<std::deque<unsigned_int,std::allocator<unsigned_int>>,void>(&too_much_buffers);
  GVar11 = 0;
  do {
    GVar11 = GVar11 + 1;
    cVar1 = (**(code **)(lVar9 + 0xc68))(GVar11);
  } while (cVar1 != '\0');
  (*this->m_pNamedBufferStorage)(GVar11,4,dummy_data,2);
  bVar2 = ErrorCheckAndLog(this,"glNamedBufferStorage",0x502,
                           " if buffer is not the name of an existing buffer object.");
  local_220 = CONCAT31(local_220._1_3_,bVar2);
  (**(code **)(lVar9 + 0x3b8))(1,&buffer);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"glCreateBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x123e);
  (*this->m_pNamedBufferStorage)(buffer,-1,dummy_data,0x88ea);
  bVar2 = ErrorCheckAndLog(this,"glNamedBufferStorage",0x501," if size is negative.");
  (*this->m_pNamedBufferStorage)(buffer,0,dummy_data,0x88ea);
  bVar3 = ErrorCheckAndLog(this,"glNamedBufferStorage",0x501," if size zero.");
  (**(code **)(lVar9 + 0x438))(1,&buffer);
  buffer = 0;
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"glDeleteBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x124f);
  bVar4 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_sparse_buffer");
  bVar5 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_NV_gpu_multicast");
  uVar13 = (uint)bVar4 << 10 | 0x3c3;
  if ((bVar5) ||
     (bVar5 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,
                         "GL_NVX_linked_gpu_multicast"), bVar5)) {
    uVar13 = (uint)bVar4 << 10 | 0xbc3;
  }
  local_220._0_1_ = (byte)local_220 & bVar2 & bVar3;
  for (uVar12 = 0; uVar12 != 0x20; uVar12 = uVar12 + 1) {
    if ((uVar13 >> (uVar12 & 0x1f) & 1) == 0) {
      (**(code **)(lVar9 + 0x3b8))(1,&buffer);
      dVar7 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar7,"glCreateBuffers failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0x1270);
      (*this->m_pNamedBufferStorage)(buffer,4,dummy_data,1 << ((byte)uVar12 & 0x1f));
      bVar2 = ErrorCheckAndLog(this,"glNamedBufferStorage",0x501,
                               " if flags has any bits set other than DYNAMIC_STORAGE_BIT, MAP_READ_BIT, MAP_WRITE_BIT, MAP_PERSISTENT_BIT, MAP_COHERENT_BIT or CLIENT_STORAGE_BIT."
                              );
      (**(code **)(lVar9 + 0x438))(1,&buffer);
      buffer = 0;
      dVar7 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar7,"glDeleteBuffers failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0x127f);
      local_220._0_1_ = (byte)local_220 & bVar2;
    }
  }
  (**(code **)(lVar9 + 0x3b8))(1,&buffer);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"glCreateBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x1288);
  (*this->m_pNamedBufferStorage)(buffer,4,dummy_data,0x40);
  bVar2 = ErrorCheckAndLog(this,"glNamedBufferStorage",0x501,
                           " if flags contains MAP_PERSISTENT_BIT but does not contain at least one of MAP_READ_BIT or MAP_WRITE_BIT."
                          );
  uVar14 = CONCAT71(extraout_var,bVar2) & 0xffffffff;
  (**(code **)(lVar9 + 0x438))(1,&buffer);
  buffer = 0;
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"glDeleteBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x1296);
  (**(code **)(lVar9 + 0x3b8))(1,&buffer);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"glCreateBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x129d);
  (*this->m_pNamedBufferStorage)(buffer,4,dummy_data,0x83);
  bVar2 = ErrorCheckAndLog(this,"glNamedBufferStorage",0x501,
                           " if flags contains MAP_COHERENT_BIT, but does not also contain MAP_PERSISTENT_BIT."
                          );
  (**(code **)(lVar9 + 0x438))(1,&buffer);
  buffer = 0;
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"glDeleteBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x12ac);
  local_220 = (undefined4)CONCAT71((int7)(uVar14 >> 8),(byte)uVar14 & (byte)local_220 & bVar2);
  iVar6 = 0x100;
  do {
    bVar2 = iVar6 == 0;
    iVar6 = iVar6 + -1;
    if (bVar2) {
      _tmp_buffer = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::operator<<((ostream *)local_1a8,
                      "Test of NamedBufferStorage out of memory negative behavior failed to generate erroneous situation. Direct State Access Buffers Test\'s MAX_NUMBER_OF_TRIES_TO_GENERATE_OUT_OF_MEMORY_ERROR is too small or the driver implementation does not inform about out of memory problem."
                     );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&tmp_buffer,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      goto LAB_00af25dc;
    }
    _tmp_buffer = (TestLog *)((ulong)_tmp_buffer & 0xffffffff00000000);
    (**(code **)(lVar9 + 0x3b8))(1,&tmp_buffer);
    dVar7 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar7,"glCreateBuffers failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                    ,0x12c5);
    std::deque<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&too_much_buffers.c,&tmp_buffer);
    (*this->m_pNamedBufferStorage)(tmp_buffer,0x7fffffffffffffff,(GLvoid *)0x0,3);
    iVar8 = (**(code **)(lVar9 + 0x800))();
  } while (iVar8 == 0);
  if (iVar8 != 0x505) {
    _tmp_buffer = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::operator<<((ostream *)local_1a8,
                    "NamedBufferStorage does not generate OUT_OF_MEMORY error if the GL is unable to create a data store with the specified size."
                   );
    std::operator<<((ostream *)local_1a8,"The error value of ");
    local_1c0.m_getName = glu::getErrorName;
    local_1c0.m_value = iVar8;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)local_1a8);
    std::operator<<((ostream *)local_1a8," was observed.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&tmp_buffer,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    local_220 = 0;
  }
LAB_00af25dc:
  if (buffer != 0) {
    (**(code **)(lVar9 + 0x438))(1,&buffer);
    buffer = 0;
  }
  while (too_much_buffers.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Deque_impl_data._M_finish._M_cur !=
         too_much_buffers.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur) {
    puVar10 = too_much_buffers.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (too_much_buffers.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur ==
        too_much_buffers.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      puVar10 = too_much_buffers.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
    }
    _tmp_buffer = (TestLog *)CONCAT44(uStack_1ac,puVar10[-1]);
    if (puVar10[-1] != 0) {
      (**(code **)(lVar9 + 0x438))(1,&tmp_buffer);
    }
    std::deque<unsigned_int,_std::allocator<unsigned_int>_>::pop_back(&too_much_buffers.c);
  }
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base
            ((_Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *)&too_much_buffers);
  return SUB41(local_220,0);
}

Assistant:

bool ErrorsTest::TestErrorsOfNamedBufferStorage()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Return value. */
	bool is_ok			= true;
	bool internal_error = false;

	/* Common variables. */
	glw::GLuint				buffer		  = 0;
	glw::GLubyte			dummy_data[4] = {};
	std::stack<glw::GLuint> too_much_buffers;

	try
	{
		/* Test invalid buffer name error behavior. */
		{
			/* Prepare for invalid buffer name error behavior verification. */
			glw::GLuint not_a_buffer_name = 0;

			while (gl.isBuffer(++not_a_buffer_name))
				;

			/* Test. */
			m_pNamedBufferStorage(not_a_buffer_name, sizeof(dummy_data), dummy_data, GL_MAP_WRITE_BIT);

			is_ok &= ErrorCheckAndLog("glNamedBufferStorage", GL_INVALID_OPERATION,
									  " if buffer is not the name of an existing buffer object.");
		}

		/* Test negative or zero size error behavior. */
		{
			/* Object creation. */
			gl.createBuffers(1, &buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

			/* Test negative size. */
			m_pNamedBufferStorage(buffer, -1, dummy_data, GL_DYNAMIC_COPY);

			is_ok &= ErrorCheckAndLog("glNamedBufferStorage", GL_INVALID_VALUE, " if size is negative.");

			/* Test zero size. */
			m_pNamedBufferStorage(buffer, 0, dummy_data, GL_DYNAMIC_COPY);

			is_ok &= ErrorCheckAndLog("glNamedBufferStorage", GL_INVALID_VALUE, " if size zero.");

			/* Clean-up. */
			gl.deleteBuffers(1, &buffer);

			buffer = 0;

			GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteBuffers failed.");
		}

		/* Test invalid usage bit error behavior. */
		{
			/* Prepare for invalid type error behavior verification. */
			glw::GLuint valid_bits = GL_DYNAMIC_STORAGE_BIT | GL_MAP_READ_BIT | GL_MAP_WRITE_BIT |
									 GL_MAP_PERSISTENT_BIT | GL_MAP_COHERENT_BIT | GL_CLIENT_STORAGE_BIT;

			if (m_context.getContextInfo().isExtensionSupported("GL_ARB_sparse_buffer"))
			{
				valid_bits |= GL_SPARSE_STORAGE_BIT_ARB;
			}

			if (m_context.getContextInfo().isExtensionSupported("GL_NV_gpu_multicast") ||
				m_context.getContextInfo().isExtensionSupported("GL_NVX_linked_gpu_multicast"))
			{
				valid_bits |= GL_PER_GPU_STORAGE_BIT_NV;
			}

			glw::GLuint invalid_bits = ~valid_bits;

			glw::GLuint bits_count = CHAR_BIT * sizeof(invalid_bits);

			/* Test. */
			for (glw::GLuint i = 0; i < bits_count; ++i)
			{
				glw::GLuint possibly_invalid_bit = (1 << i);

				if (invalid_bits & possibly_invalid_bit)
				{
					/* Object creation. */
					gl.createBuffers(1, &buffer);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

					/* Test invalid bit. */
					m_pNamedBufferStorage(buffer, sizeof(dummy_data), dummy_data, possibly_invalid_bit);

					is_ok &=
						ErrorCheckAndLog("glNamedBufferStorage", GL_INVALID_VALUE,
										 " if flags has any bits set other than DYNAMIC_STORAGE_BIT, MAP_READ_BIT,"
										 " MAP_WRITE_BIT, MAP_PERSISTENT_BIT, MAP_COHERENT_BIT or CLIENT_STORAGE_BIT.");

					/* Release object. */
					gl.deleteBuffers(1, &buffer);

					buffer = 0;

					GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteBuffers failed.");
				}
			}
		}

		/* Test improper persistent bit behavior error behavior. */
		{
			/* Object creation. */
			gl.createBuffers(1, &buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

			/* Test. */
			m_pNamedBufferStorage(buffer, sizeof(dummy_data), dummy_data, GL_MAP_PERSISTENT_BIT);

			is_ok &= ErrorCheckAndLog("glNamedBufferStorage", GL_INVALID_VALUE, " if flags contains MAP_PERSISTENT_BIT "
																				"but does not contain at least one of "
																				"MAP_READ_BIT or MAP_WRITE_BIT.");

			/* Clean-up. */
			gl.deleteBuffers(1, &buffer);

			buffer = 0;

			GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteBuffers failed.");
		}

		/* Test improper persistent bit behavior error behavior. */
		{
			/* Object creation. */
			gl.createBuffers(1, &buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

			/* Test. */
			m_pNamedBufferStorage(buffer, sizeof(dummy_data), dummy_data,
								  GL_MAP_READ_BIT | GL_MAP_WRITE_BIT | GL_MAP_COHERENT_BIT);

			is_ok &=
				ErrorCheckAndLog("glNamedBufferStorage", GL_INVALID_VALUE,
								 " if flags contains MAP_COHERENT_BIT, but does not also contain MAP_PERSISTENT_BIT.");

			/* Clean-up. */
			gl.deleteBuffers(1, &buffer);

			buffer = 0;

			GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteBuffers failed.");
		}

		/* Test out of memory error behavior. */
		{
			/* Calculate maximum buffer size (depending on number of bits of function argument). */
			glw::GLsizei max_pointer_unsigned_bits =
				(CHAR_BIT * sizeof(glw::GLsizeiptr) - 1) /* do not include possible sign bit */;
			glw::GLsizeiptr max_possible_size = 0;

			for (glw::GLsizei i = 0; i < max_pointer_unsigned_bits; ++i)
			{
				max_possible_size |= ((glw::GLsizeiptr)1 << i);
			}

			/* Error storing variable. */
			glw::GLenum error = GL_NO_ERROR;

			/* Try to overflow by allocating biggest possible buffers in a loop. */
			for (glw::GLuint i = 0; i < MAX_NUMBER_OF_TRIES_TO_GENERATE_OUT_OF_MEMORY_ERROR; ++i)
			{
				/* New big buffer creation. */
				glw::GLuint tmp_buffer = 0;

				gl.createBuffers(1, &tmp_buffer);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

				/* Add it to delete list. */
				too_much_buffers.push(tmp_buffer);

				/* Try to allocate big buffer storage. */
				m_pNamedBufferStorage(tmp_buffer, max_possible_size, DE_NULL, GL_MAP_READ_BIT | GL_MAP_WRITE_BIT);

				/* Check for errors. */
				error = gl.getError();

				if (error != GL_NO_ERROR)
				{
					break;
				}
			}

			if (error == GL_NO_ERROR)
			{
				/* Log. */
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Test of NamedBufferStorage out of memory negative behavior failed to "
												"generate erroneous situation. "
												"Direct State Access Buffers Test's "
												"MAX_NUMBER_OF_TRIES_TO_GENERATE_OUT_OF_MEMORY_ERROR is too small or "
												"the driver implementation does not inform about out of memory problem."
					<< tcu::TestLog::EndMessage;
			}
			else
			{
				if (error != GL_OUT_OF_MEMORY)
				{
					/* Log. */
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "NamedBufferStorage does not generate OUT_OF_MEMORY error if the "
													"GL is unable to create a data store with the specified size."
						<< "The error value of " << glu::getErrorStr(error) << " was observed."
						<< tcu::TestLog::EndMessage;

					is_ok = false;
				}
			}
		}
	}
	catch (...)
	{
		is_ok		   = false;
		internal_error = true;
	}

	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);

		buffer = 0;
	}

	while (!too_much_buffers.empty())
	{
		glw::GLuint tmp_buffer = too_much_buffers.top();

		if (tmp_buffer)
		{
			gl.deleteBuffers(1, &tmp_buffer);
		}

		too_much_buffers.pop();
	}

	if (internal_error)
	{
		throw 0;
	}

	return is_ok;
}